

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::Demangle(char *mangled,char *out,int out_size)

{
  char *str;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  State local_30;
  
  local_30.parse_state.prev_name_idx = 0;
  local_30.parse_state._12_4_ = 0xffffffff;
  local_30.parse_state.mangled_idx = 0;
  local_30.parse_state.out_cur_idx = 0;
  local_30.recursion_depth = 1;
  local_30.steps = 1;
  local_30.mangled_begin = mangled;
  local_30.out = out;
  local_30.out_end_idx = out_size;
  bVar5 = ParseMangledName(&local_30);
  if (bVar5) {
    lVar6 = (long)local_30.parse_state.mangled_idx;
    if (local_30.mangled_begin[lVar6] != '\0') {
      str = local_30.mangled_begin + lVar6;
      lVar7 = 0;
      do {
        if (str[lVar7] != '.') {
          if (str[lVar7] == '\0') goto LAB_0014a937;
          break;
        }
        bVar1 = str[lVar7 + 1];
        bVar5 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
        if (bVar1 == 0x5f || bVar5) {
          lVar7 = lVar7 + 1;
          do {
            do {
              bVar2 = local_30.mangled_begin[lVar7 + lVar6 + 1];
              lVar7 = lVar7 + 1;
            } while (bVar2 == 0x5f);
          } while ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a);
          bVar3 = true;
          if (bVar2 == 0x2e) goto LAB_0014a8ee;
        }
        else {
LAB_0014a8ee:
          bVar3 = bVar1 == 0x5f || bVar5;
          if ((byte)(str[lVar7 + 1] - 0x30U) < 10) {
            lVar7 = lVar7 + 1;
            do {
              lVar4 = lVar7 + lVar6 + 1;
              lVar7 = lVar7 + 1;
            } while ((byte)(local_30.mangled_begin[lVar4] - 0x30U) < 10);
            bVar3 = true;
          }
        }
      } while (bVar3);
      if (local_30.mangled_begin[lVar6] != '@') goto LAB_0014a94b;
      MaybeAppend(&local_30,str);
    }
LAB_0014a937:
    bVar5 = 0 < local_30.parse_state.out_cur_idx &&
            local_30.parse_state.out_cur_idx < local_30.out_end_idx;
  }
  else {
LAB_0014a94b:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Demangle(const char *mangled, char *out, int out_size) {
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}